

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::Flip(ON_Plane *this)

{
  ON_3dVector local_40;
  double local_28;
  ON_3dVector v;
  ON_Plane *this_local;
  
  local_28 = (this->xaxis).x;
  v.x = (this->xaxis).y;
  v.y = (this->xaxis).z;
  (this->xaxis).x = (this->yaxis).x;
  (this->xaxis).y = (this->yaxis).y;
  (this->xaxis).z = (this->yaxis).z;
  (this->yaxis).x = local_28;
  (this->yaxis).y = v.x;
  (this->yaxis).z = v.y;
  v.z = (double)this;
  ON_3dVector::operator-(&local_40,&this->zaxis);
  (this->zaxis).x = local_40.x;
  (this->zaxis).y = local_40.y;
  (this->zaxis).z = local_40.z;
  UpdateEquation(this);
  return true;
}

Assistant:

bool ON_Plane::Flip()
{
  ON_3dVector v = xaxis;
  xaxis = yaxis;
  yaxis = v;
  zaxis = -zaxis;
  UpdateEquation();
  return true;
}